

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.h
# Opt level: O2

subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
* __thiscall
slang::ast::ValueSymbol::drivers
          (subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
           *__return_storage_ptr__,ValueSymbol *this)

{
  EVP_PKEY_CTX *ctx;
  const_iterator local_d0;
  iterator local_90;
  const_iterator local_50;
  
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::begin(&local_90,&this->driverMap)
  ;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::end
            ((iterator *)&local_d0,&this->driverMap);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::const_iterator
            (&local_50,&local_d0);
  ctx = (EVP_PKEY_CTX *)&local_90;
  std::ranges::
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  ::subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator>
            (__return_storage_ptr__,(iterator *)ctx,&local_50);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_50.path,ctx);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d0.path,ctx);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
             &local_90.super_const_iterator.path,ctx);
  return __return_storage_ptr__;
}

Assistant:

std::ranges::subrange<DriverIntervalMap::const_iterator> drivers() const {
        return {driverMap.begin(), driverMap.end()};
    }